

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cs.cpp
# Opt level: O0

void InitializeCriticalSection(LPCRITICAL_SECTION lpCriticalSection)

{
  LPCRITICAL_SECTION lpCriticalSection_local;
  
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  CorUnix::InternalInitializeCriticalSectionAndSpinCount(lpCriticalSection,0,false);
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  return;
}

Assistant:

void InitializeCriticalSection(LPCRITICAL_SECTION lpCriticalSection)
{
    PERF_ENTRY(InitializeCriticalSection);
    ENTRY("InitializeCriticalSection(lpCriticalSection=%p)\n",
          lpCriticalSection);

    InternalInitializeCriticalSectionAndSpinCount(lpCriticalSection,
                                                  0, false);

    LOGEXIT("InitializeCriticalSection returns void\n");
    PERF_EXIT(InitializeCriticalSection);
}